

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_xml.c
# Opt level: O0

genxWriter p2sc_xml_start(p2sc_buffer_t *buf)

{
  genxStatus gVar1;
  genxWriter w_00;
  char *pcVar2;
  _func_void_ptr_void_ptr_int *in_RDI;
  genxWriter w;
  genxStatus status;
  void *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  w_00 = genxNew(in_RDI,(_func_void_void_ptr_void_ptr *)
                        CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffe8);
  if (in_RDI == (_func_void_ptr_void_ptr_int *)0x0) {
    gVar1 = genxStartDocFile(w_00,_stdout);
  }
  else {
    gVar1 = genxStartDocSender(w_00,&bufSender);
  }
  if (gVar1 != GENX_SUCCESS) {
    pcVar2 = genxLastErrorMessage(w_00);
    _p2sc_msg("p2sc_xml_start",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_xml.c"
              ,0x6a,"$Id: p2sc_xml.c 5108 2014-06-19 12:29:23Z bogdan $",0x12c0,"Genx: %s",pcVar2);
    exit(1);
  }
  return w_00;
}

Assistant:

genxWriter p2sc_xml_start(p2sc_buffer_t *buf) {
    genxStatus status;
    genxWriter w = genxNew(NULL, NULL, buf);

    /* if buf is NULL, write to stdout */
    if (buf)
        status = genxStartDocSender(w, &bufSender);
    else
        status = genxStartDocFile(w, stdout);

    GENX_Try(w, status);

    return w;
}